

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall Socket::Socket(Socket *this)

{
  int iVar1;
  SocketError *this_00;
  allocator local_31;
  string local_30 [32];
  Socket *local_10;
  Socket *this_local;
  
  local_10 = this;
  iVar1 = socket(2,1,0);
  this->socketDescriptor = iVar1;
  if (this->socketDescriptor == 0) {
    this_00 = (SocketError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Socket error: could not create socket!",&local_31);
    SocketError::SocketError(this_00,(string *)local_30,0);
    __cxa_throw(this_00,&SocketError::typeinfo,SocketError::~SocketError);
  }
  return;
}

Assistant:

Socket::Socket()
{
    socketDescriptor = socket(AF_INET, SOCK_STREAM, 0);
    if(socketDescriptor == 0)
    {
        throw SocketError("Socket error: could not create socket!");
    }
}